

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_socket_peer_name(nng_socket id,char **name)

{
  char *pcVar1;
  nni_sock *local_28;
  nni_sock *sock;
  char **ppcStack_18;
  int rv;
  char **name_local;
  nng_socket id_local;
  
  ppcStack_18 = name;
  name_local._0_4_ = id.id;
  sock._4_4_ = nni_sock_find(&local_28,id.id);
  name_local._4_4_ = sock._4_4_;
  if (sock._4_4_ == 0) {
    pcVar1 = nni_sock_peer_name(local_28);
    *ppcStack_18 = pcVar1;
    nni_sock_rele(local_28);
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int
nng_socket_peer_name(nng_socket id, const char **name)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	*name = nni_sock_peer_name(sock);
	nni_sock_rele(sock);
	return (0);
}